

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blip_Buffer.cpp
# Opt level: O0

blargg_err_t __thiscall Blip_Buffer::set_sample_rate(Blip_Buffer *this,long new_rate,int msec)

{
  int in_EDX;
  long in_RSI;
  Blip_Buffer *in_RDI;
  void *p;
  long s;
  long new_size;
  long in_stack_ffffffffffffffb8;
  buf_t_ *in_stack_ffffffffffffffc8;
  int entire_buffer;
  Blip_Buffer *in_stack_ffffffffffffffd0;
  Blip_Buffer *local_28;
  blargg_err_t local_8;
  
  if (in_RDI->buffer_size_ == 1) {
    local_8 = "Internal (tried to resize Silent_Blip_Buffer)";
  }
  else {
    local_28 = (Blip_Buffer *)0xffad;
    if ((in_EDX != 0) &&
       (in_stack_ffffffffffffffd0 = (Blip_Buffer *)((in_RSI * (in_EDX + 1) + 999) / 1000),
       (long)in_stack_ffffffffffffffd0 < 0xffad)) {
      local_28 = in_stack_ffffffffffffffd0;
    }
    if ((Blip_Buffer *)(long)in_RDI->buffer_size_ != local_28) {
      in_stack_ffffffffffffffc8 =
           (buf_t_ *)realloc(in_RDI->buffer_,(long)((long)&local_28->buffer_size_ + 2) * 4);
      if (in_stack_ffffffffffffffc8 == (buf_t_ *)0x0) {
        local_8 = "Out of memory";
        return local_8;
      }
      in_RDI->buffer_ = in_stack_ffffffffffffffc8;
    }
    entire_buffer = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
    in_RDI->buffer_size_ = (blip_long)local_28;
    in_RDI->sample_rate_ = in_RSI;
    in_RDI->length_ = (int)(((long)local_28 * 1000) / in_RSI) + -1;
    if (in_RDI->clock_rate_ != 0) {
      clock_rate(in_RDI,in_stack_ffffffffffffffb8);
    }
    bass_freq(in_RDI,in_RDI->bass_freq_);
    clear(in_stack_ffffffffffffffd0,entire_buffer);
    local_8 = (blargg_err_t)0x0;
  }
  return local_8;
}

Assistant:

Blip_Buffer::blargg_err_t Blip_Buffer::set_sample_rate( long new_rate, int msec )
{
	if ( buffer_size_ == silent_buf_size )
	{
		assert( 0 );
		return "Internal (tried to resize Silent_Blip_Buffer)";
	}
	
	// start with maximum length that resampled time can represent
	long new_size = (UINT_MAX >> BLIP_BUFFER_ACCURACY) - blip_buffer_extra_ - 64;
	if ( msec != blip_max_length )
	{
		long s = (new_rate * (msec + 1) + 999) / 1000;
		if ( s < new_size )
			new_size = s;
		else
			assert( 0 ); // fails if requested buffer length exceeds limit
	}
	
	if ( buffer_size_ != new_size )
	{
		void* p = realloc( buffer_, (new_size + blip_buffer_extra_) * sizeof *buffer_ );
		if ( !p )
			return "Out of memory";
		buffer_ = (buf_t_*) p;
	}
	
	buffer_size_ = new_size;
	assert( buffer_size_ != silent_buf_size );
	
	// update things based on the sample rate
	sample_rate_ = new_rate;
	length_ = new_size * 1000 / new_rate - 1;
	if ( msec )
		assert( length_ == msec ); // ensure length is same as that passed in
	if ( clock_rate_ )
		clock_rate( clock_rate_ );
	bass_freq( bass_freq_ );
	
	clear();
	
	return 0; // success
}